

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O0

ma_result ma_notch2_init_preallocated(ma_notch2_config *pConfig,void *pHeap,ma_notch2 *pFilter)

{
  void *in_RDX;
  undefined4 *in_RDI;
  void *pHeap_00;
  ma_biquad_config *pConfig_00;
  ma_biquad_config bqConfig_1;
  ma_biquad_config bqConfig;
  ma_result result;
  double a;
  double c;
  double s;
  double w;
  double q;
  undefined4 local_f0;
  undefined4 local_ec;
  undefined8 local_e8;
  double local_e0;
  ma_biquad *pBQ;
  undefined1 local_b8 [80];
  undefined4 *local_68;
  ma_result local_5c;
  undefined8 local_58;
  double local_48;
  double local_40;
  double local_38;
  double local_30;
  double local_28;
  undefined4 *local_20;
  double local_18;
  double local_10;
  double local_8;
  
  if (in_RDX == (void *)0x0) {
    local_5c = MA_INVALID_ARGS;
  }
  else {
    local_58 = 0x40;
    local_68 = in_RDI;
    if (in_RDX != (void *)0x0) {
      memset(in_RDX,0,0x40);
    }
    if (local_68 == (undefined4 *)0x0) {
      local_5c = MA_INVALID_ARGS;
    }
    else {
      local_20 = local_68;
      local_28 = *(double *)(local_68 + 4);
      local_30 = (*(double *)(local_68 + 6) * 6.283185307179586) / (double)(uint)local_68[2];
      local_18 = local_30;
      local_38 = sin(local_30);
      local_10 = local_30;
      local_8 = 1.5707963267948966 - local_30;
      local_40 = sin(local_8);
      local_48 = local_38 / (local_28 * 2.0);
      local_e8 = 0x3ff0000000000000;
      local_e0 = local_40 * -2.0;
      pBQ = (ma_biquad *)0x3ff0000000000000;
      pHeap_00 = (void *)(local_48 + 1.0);
      pConfig_00 = (ma_biquad_config *)(local_40 * -2.0);
      local_f0 = *local_20;
      local_ec = local_20[1];
      memcpy(local_b8,&local_f0,0x38);
      local_5c = ma_biquad_init_preallocated(pConfig_00,pHeap_00,pBQ);
      if (local_5c == MA_SUCCESS) {
        local_5c = MA_SUCCESS;
      }
    }
  }
  return local_5c;
}

Assistant:

MA_API ma_result ma_notch2_init_preallocated(const ma_notch2_config* pConfig, void* pHeap, ma_notch2* pFilter)
{
    ma_result result;
    ma_biquad_config bqConfig;

    if (pFilter == NULL) {
        return MA_INVALID_ARGS;
    }

    MA_ZERO_OBJECT(pFilter);

    if (pConfig == NULL) {
        return MA_INVALID_ARGS;
    }

    bqConfig = ma_notch2__get_biquad_config(pConfig);
    result = ma_biquad_init_preallocated(&bqConfig, pHeap, &pFilter->bq);
    if (result != MA_SUCCESS) {
        return result;
    }

    return MA_SUCCESS;
}